

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_getfileinfo(LispPTR *args)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  LispPTR LVar4;
  char *lf_cp;
  LispPTR *pLVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  passwd *ppVar10;
  size_t sVar11;
  long lVar12;
  DLword *pDVar13;
  char ver [16];
  stat sbuf;
  char name [255];
  char host [255];
  char file [4096];
  char lfname [4101];
  char dir [4096];
  
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  pLVar5 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar5 + 6) == 'D') {
    iVar3 = pLVar5[2] * 2 + 5;
LAB_0011aaa5:
    if (0x1005 < iVar3) {
      *Lisp_errno = 200;
      return 0;
    }
  }
  else {
    if (*(char *)((long)pLVar5 + 6) == 'C') {
      iVar3 = pLVar5[2] + 3;
      goto LAB_0011aaa5;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar5 = NativeAligned4FromLAddr(*args);
  LVar4 = 0x1000;
  if ((int)pLVar5[2] < 0x1000) {
    LVar4 = pLVar5[2];
  }
  lVar6 = (long)(int)LVar4;
  if (*(char *)((long)pLVar5 + 6) == 'D') {
    pDVar13 = Lisp_world + (ulong)(ushort)pLVar5[1] + (ulong)(*pLVar5 & 0xfffffff);
    for (lVar12 = 0; lVar6 != lVar12; lVar12 = lVar12 + 1) {
      lfname[lVar12] = *(char *)((ulong)pDVar13 ^ 2);
      pDVar13 = pDVar13 + 1;
    }
    lfname[lVar12] = '\0';
  }
  else if (*(char *)((long)pLVar5 + 6) == 'C') {
    uVar2 = *pLVar5;
    LVar4 = pLVar5[1];
    for (lVar12 = 0; lVar6 != lVar12; lVar12 = lVar12 + 1) {
      lfname[lVar12] =
           *(char *)((long)Lisp_world +
                     lVar12 + (ulong)(ushort)LVar4 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
    }
    lfname[lVar6] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  pcVar7 = host;
  separate_host(lfname,pcVar7);
  for (; cVar1 = *pcVar7, cVar1 != '\0'; pcVar7 = pcVar7 + 1) {
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      *pcVar7 = cVar1 + -0x20;
    }
  }
  if (host._0_4_ == 0x4b5344) {
    unixpathname(lfname,file,1,0);
    iVar3 = unpack_filename(file,dir,name,ver,1);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = true_name(dir);
    if (iVar3 != -1) {
      return 0;
    }
    if (name[0] == '\0') {
      strcpy(file,dir);
    }
    else {
      iVar3 = get_version_array(dir,name);
      if (iVar3 == 0) {
        return 0;
      }
      strcpy(file,name);
      if (ver[0] != '\0') {
        sVar8 = strlen(file);
        (file + sVar8)[0] = '.';
        (file + sVar8)[1] = '~';
        file[sVar8 + 2] = '\0';
        strcat(file,ver);
        sVar8 = strlen(file);
        (file + sVar8)[0] = '~';
        (file + sVar8)[1] = '\0';
      }
      iVar3 = get_old(dir,VA.files,file,name);
      if (iVar3 == 0) {
        return 0;
      }
    }
  }
  else {
    iVar3 = bcmp(host,"UNIX",5);
    if (iVar3 != 0) {
      return 0;
    }
    unixpathname(lfname,file,0,0);
  }
  alarm(TIMEOUT_TIME);
  piVar9 = __errno_location();
  do {
    *piVar9 = 0;
    iVar3 = stat(file,(stat *)&sbuf);
    if (iVar3 != -1) break;
  } while (*piVar9 == 4);
  LVar4 = 0;
  alarm(0);
  if (iVar3 != 0) {
    *Lisp_errno = *piVar9;
    return 0;
  }
  switch(args[1]) {
  case 0xe0001:
    pLVar5 = NativeAligned4FromLAddr(args[2]);
    sbuf.st_mode = (LispPTR)sbuf.st_size;
    break;
  case 0xe0002:
    pLVar5 = NativeAligned4FromLAddr(args[2]);
    sbuf.st_mode = (int)sbuf.st_mtim.tv_sec + 0x1c94b00;
    break;
  case 0xe0003:
    pLVar5 = NativeAligned4FromLAddr(args[2]);
    sbuf.st_mode = (int)sbuf.st_atim.tv_sec + 0x1c94b00;
    break;
  default:
    goto switchD_0011ada2_caseD_e0004;
  case 0xe0005:
    alarm(TIMEOUT_TIME);
    do {
      *piVar9 = 0;
      ppVar10 = getpwuid(sbuf.st_uid);
      if (ppVar10 != (passwd *)0x0) {
        alarm(0);
        pLVar5 = NativeAligned4FromLAddr(args[2]);
        pDVar13 = Lisp_world;
        uVar2 = *pLVar5;
        pcVar7 = ppVar10->pw_name;
        sVar8 = strlen(pcVar7);
        for (sVar11 = 0; sVar8 != sVar11; sVar11 = sVar11 + 1) {
          *(char *)((long)pDVar13 + sVar11 + (uVar2 & 0xfffffff) * 2 ^ 3) = pcVar7[sVar11];
        }
LAB_0011afe6:
        LVar4 = GetPosSmallp(sVar8);
        return LVar4;
      }
    } while (*piVar9 == 4);
    goto LAB_0011aef3;
  case 0xe0006:
    pLVar5 = NativeAligned4FromLAddr(args[2]);
    break;
  case 0xe0008:
    LVar4 = car(args[2]);
    LVar4 = cdr(LVar4);
    pLVar5 = NativeAligned4FromLAddr(LVar4);
    *pLVar5 = (LispPTR)sbuf.st_size;
    LVar4 = cdr(args[2]);
    LVar4 = car(LVar4);
    LVar4 = cdr(LVar4);
    pLVar5 = NativeAligned4FromLAddr(LVar4);
    *pLVar5 = (int)sbuf.st_mtim.tv_sec + 0x1c94b00;
    LVar4 = cdr(args[2]);
    LVar4 = cdr(LVar4);
    LVar4 = car(LVar4);
    LVar4 = cdr(LVar4);
    pLVar5 = NativeAligned4FromLAddr(LVar4);
    *pLVar5 = (int)sbuf.st_atim.tv_sec + 0x1c94b00;
    LVar4 = cdr(args[2]);
    LVar4 = cdr(LVar4);
    LVar4 = cdr(LVar4);
    LVar4 = car(LVar4);
    LVar4 = cdr(LVar4);
    pLVar5 = NativeAligned4FromLAddr(LVar4);
    *pLVar5 = sbuf.st_mode;
    alarm(TIMEOUT_TIME);
    do {
      *piVar9 = 0;
      ppVar10 = getpwuid(sbuf.st_uid);
      if (ppVar10 != (passwd *)0x0) {
        alarm(0);
        LVar4 = cdr(args[2]);
        LVar4 = cdr(LVar4);
        LVar4 = cdr(LVar4);
        LVar4 = cdr(LVar4);
        LVar4 = car(LVar4);
        LVar4 = cdr(LVar4);
        pLVar5 = NativeAligned4FromLAddr(LVar4);
        pDVar13 = Lisp_world;
        uVar2 = *pLVar5;
        pcVar7 = ppVar10->pw_name;
        sVar8 = strlen(pcVar7);
        for (sVar11 = 0; sVar8 != sVar11; sVar11 = sVar11 + 1) {
          *(char *)((long)pDVar13 + sVar11 + (uVar2 & 0xfffffff) * 2 ^ 3) = pcVar7[sVar11];
        }
        goto LAB_0011afe6;
      }
    } while (*piVar9 == 4);
LAB_0011aef3:
    alarm(0);
    return 0xe0000;
  }
  *pLVar5 = sbuf.st_mode;
  LVar4 = 0x4c;
switchD_0011ada2_caseD_e0004:
  return LVar4;
}

Assistant:

LispPTR COM_getfileinfo(LispPTR *args)
{
  int dskp, rval;
  size_t len;
  unsigned *bufp;
#ifndef DOS
  struct passwd *pwd;
#endif
  char *base;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
  LispPTR laddr;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for GETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (strcmp(name, "") == 0) {
      /*
       * The directory is specified.
       */
      strcpy(file, dir);
    } else {
      if (get_version_array(dir, name) == 0) return (NIL);
      ConcNameAndVersion(name, ver, file);
      if (get_old(dir, VA.files, file, name) == 0) return (NIL);
    }
  }

  TIMEOUT(rval = stat(file, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  switch (args[1]) {
    case LENGTH:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)sbuf.st_size;
      return (ATOM_T);

    case WDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_mtime);
      return (ATOM_T);

    case RDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_atime);
      return (ATOM_T);

    case PROTECTION:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = sbuf.st_mode;
      return (ATOM_T);

    case AUTHOR: {
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        /*
         * Returns Lisp 0.  Lisp code handles this case as author
         * unknown.  The returned value from Lisp GETFILEINFO
         * function would be "".
         */
        return (SMALLP_ZERO);
      }
      STRING_BASE(args[2], base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    case ALL: {
      /*
       * The format of the buffer which has been allocated by Lisp
       * is as follows.
       * 	((LENGTH	.	fixp)
       *	 (WDATE		.	fixp)
       *	 (RDATE		.	fixp)
       *	 (PROTECTION	.	fixp)
       *	 (AUTHOR	.	string))
       */
      laddr = cdr(car(args[2]));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_size;

      laddr = cdr(car(cdr(args[2])));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_mtime);

      laddr = cdr(car(cdr(cdr(args[2]))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_atime);

      laddr = cdr(car(cdr(cdr(cdr(args[2])))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_mode;
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) { return (SMALLP_ZERO); }
      laddr = cdr(car(cdr(cdr(cdr(cdr(args[2]))))));
      STRING_BASE(laddr, base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP	 */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    default: return (NIL);
  }
}